

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall xemmai::t_emit::f_join(t_emit *this,t_block *a_junction)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  t_emit *this_00;
  value_type *x;
  ulong local_20;
  size_t i;
  t_block *a_junction_local;
  t_emit *this_local;
  
  i = (size_t)a_junction;
  a_junction_local = (t_block *)this;
  for (local_20 = 0; uVar1 = local_20,
      sVar3 = std::
              vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
              ::size((vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                      *)(i + 0x10)), uVar1 < sVar3; local_20 = local_20 + 1) {
    _x = std::vector<bool,_std::allocator<bool>_>::operator[](this->v_privates,local_20);
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&x);
    if (((!bVar2) &&
        (pvVar4 = std::
                  vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                  ::operator[]((vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                                *)(i + 0x10),local_20), (pvVar4->v_use & 1U) != 0)) &&
       ((pvVar4->v_in & 1U) != 0)) {
      this_00 = operator<<(this,c_instruction__NUL);
      operator<<(this_00,this->v_arguments + local_20);
    }
  }
  return;
}

Assistant:

void t_emit::f_join(const ast::t_block& a_junction)
{
	for (size_t i = 0; i < a_junction.v_privates.size(); ++i) {
		if ((*v_privates)[i]) continue;
		auto& x = a_junction.v_privates[i];
		if (x.v_use && x.v_in) *this << c_instruction__NUL << v_arguments + i;
	}
}